

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessSamplersTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::DirectStateAccess::Samplers::CreationTest::iterate(CreationTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ContextType ctxType;
  deUint32 err;
  undefined4 extraout_var;
  char *description;
  long lVar6;
  qpTestResult testResult;
  TestContext *this_01;
  GLuint samplers_dsa [2];
  int local_1b8 [2];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar5;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    local_1b8[0] = 0;
    local_1b8[1] = 0;
    (**(code **)(lVar5 + 1000))(2);
    err = (**(code **)(lVar5 + 0x800))();
    glu::checkError(err,"glCreateSamplers have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                    ,100);
    this_00 = (ostringstream *)(local_1b0 + 8);
    bVar1 = true;
    lVar6 = 0;
    do {
      cVar3 = (**(code **)(lVar5 + 0xcb0))(local_1b8[lVar6]);
      if (cVar3 == '\0') {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"CreateSamplers has not created defualt objects.",0x2f);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        bVar1 = false;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    lVar6 = 0;
    do {
      if (*(int *)((long)local_1b8 + lVar6) != 0) {
        (**(code **)(lVar5 + 0x468))(1);
        *(undefined4 *)((long)local_1b8 + lVar6) = 0;
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 == 4);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar1) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CreationTest::iterate()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Samplers objects */
	static const glw::GLuint samplers_count = 2;

	glw::GLuint samplers_dsa[samplers_count] = {};

	try
	{
		/* Check direct state creation. */
		gl.createSamplers(samplers_count, samplers_dsa);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateSamplers have failed");

		for (glw::GLuint i = 0; i < samplers_count; ++i)
		{
			if (!gl.isSampler(samplers_dsa[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "CreateSamplers has not created defualt objects."
													<< tcu::TestLog::EndMessage;
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	for (glw::GLuint i = 0; i < samplers_count; ++i)
	{
		if (samplers_dsa[i])
		{
			gl.deleteSamplers(1, &samplers_dsa[i]);

			samplers_dsa[i] = 0;
		}
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}